

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall FlowGraph::VerifyLoopGraph(FlowGraph *this)

{
  code *pcVar1;
  FlowEdge **this_00;
  NodeBase *this_01;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  BOOL BVar3;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_02;
  undefined4 *puVar4;
  Type_conflict node;
  Type *ppFVar5;
  BasicBlock *pBVar6;
  Func *pFVar7;
  BasicBlock *pBVar8;
  BasicBlock *succ;
  FlowEdge **__edge;
  Iterator __iter;
  Loop *loop;
  BasicBlock *block;
  FlowGraph *this_local;
  
  loop = (Loop *)this->blockList;
  do {
    if (loop == (Loop *)0x0) {
      return;
    }
    if ((loop->loopNumber & 1) == 0) {
      __iter.current = (NodeBase *)loop->topFunc;
      this_02 = &BasicBlock::GetSuccList((BasicBlock *)loop)->
                 super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_02);
      while( true ) {
        if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        this_00 = __edge;
        node = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node)
        ;
        if (bVar2) break;
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        ppFVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&__edge);
        pBVar8 = FlowEdge::GetSucc(*ppFVar5);
        if (pBVar8 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0xf6f,"(succ)","succ");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        if ((Loop *)__iter.current == pBVar8->loop) {
          if (((*(ushort *)&pBVar8->field_0x18 >> 2 & 1) != 0) &&
             (pBVar6 = Loop::GetHeadBlock((Loop *)__iter.current), pBVar6 != pBVar8)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0xf73,
                               "(succ->isLoopHeader == false || loop->GetHeadBlock() == succ)",
                               "succ->isLoopHeader == false || loop->GetHeadBlock() == succ");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
        }
        else if ((*(ushort *)&pBVar8->field_0x18 >> 2 & 1) == 0) {
          if ((pBVar8->loop != (Loop *)0x0) &&
             (bVar2 = Loop::IsDescendentOrSelf(pBVar8->loop,(Loop *)__iter.current), !bVar2)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0xf7c,
                               "(succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop))",
                               "succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
        }
        else if ((pBVar8->loop->parent != (Loop *)__iter.current) &&
                (bVar2 = Loop::IsDescendentOrSelf((Loop *)__iter.current,pBVar8->loop), bVar2)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0xf79,
                             "(succ->loop->parent == loop || (!loop->IsDescendentOrSelf(succ->loop)))"
                             ,
                             "succ->loop->parent == loop || (!loop->IsDescendentOrSelf(succ->loop))"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
      pFVar7 = GetFunc(this);
      sourceContextId = Func::GetSourceContextId(pFVar7);
      pFVar7 = GetFunc(this);
      functionId = Func::GetLocalFunctionId(pFVar7);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01eafdf0,RemoveBreakBlockPhase,sourceContextId,functionId);
      if ((((!bVar2) && (__iter.current != (NodeBase *)0x0)) &&
          (((ushort)loop->loopNumber >> 2 & 1) == 0)) &&
         ((BVar3 = Func::HasTry(this->func), BVar3 == 0 ||
          (bVar2 = Func::DoOptimizeTry(this->func), bVar2)))) {
        this_01 = __iter.current;
        pBVar8 = BasicBlock::GetPrev((BasicBlock *)loop);
        bVar2 = Loop::IsDescendentOrSelf((Loop *)this_01,pBVar8->loop);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0xf84,"(loop->IsDescendentOrSelf(block->GetPrev()->loop))",
                             "loop->IsDescendentOrSelf(block->GetPrev()->loop)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    loop = *(Loop **)loop;
  } while( true );
}

Assistant:

void
FlowGraph::VerifyLoopGraph()
{
    FOREACH_BLOCK(block, this)
    {
        Loop *loop = block->loop;
        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (loop == succ->loop)
            {
                Assert(succ->isLoopHeader == false || loop->GetHeadBlock() == succ);
                continue;
            }
            if (succ->isLoopHeader)
            {
                Assert(succ->loop->parent == loop
                    || (!loop->IsDescendentOrSelf(succ->loop)));
                continue;
            }
            Assert(succ->loop == nullptr || succ->loop->IsDescendentOrSelf(loop));
        } NEXT_SUCCESSOR_BLOCK;

        if (!PHASE_OFF(Js::RemoveBreakBlockPhase, this->GetFunc()))
        {
            // Make sure all break blocks have been removed.
            if (loop && !block->isLoopHeader && !(this->func->HasTry() && !this->func->DoOptimizeTry()))
            {
                Assert(loop->IsDescendentOrSelf(block->GetPrev()->loop));
            }
        }
    } NEXT_BLOCK;
}